

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsModelsLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::LibraryKinematicsModelsLoader::begin__kinematics_model
          (LibraryKinematicsModelsLoader *this,kinematics_model__AttributeData *attributeData)

{
  ParserChar *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  KinematicsModel *this_00;
  SidTreeNode *pSVar3;
  ParserChar *name;
  URI uri;
  allocator<char> local_131;
  String local_130;
  URI local_110;
  
  iVar2 = (*(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[0xb])();
  name = (ParserChar *)0x0;
  COLLADABU::URI::URI(&local_110,(URI *)CONCAT44(extraout_var,iVar2),false);
  if (attributeData->id != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,attributeData->id,&local_131);
    COLLADABU::URI::setFragment(&local_110,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    name = attributeData->id;
  }
  pPVar1 = attributeData->name;
  this_00 = (KinematicsModel *)operator_new(0x130);
  if (pPVar1 != (ParserChar *)0x0) {
    name = pPVar1;
  }
  KinematicsModel::KinematicsModel(this_00,&local_110,name);
  this->mCurrentKinematicsModel = this_00;
  pSVar3 = IFilePartLoader::addToSidTree
                     ((IFilePartLoader *)this,attributeData->id,(char *)0x0,
                      (IntermediateTargetable *)this_00);
  this->mCurrentKinematicsModel->mSidTreeNode = pSVar3;
  COLLADABU::URI::~URI(&local_110);
  return true;
}

Assistant:

bool LibraryKinematicsModelsLoader::begin__kinematics_model( const kinematics_model__AttributeData& attributeData )
	{
		COLLADABU::URI uri(getFileUri());
		if ( attributeData.id )
		{
			uri.setFragment( attributeData.id );
		}

		const char* name = 0;
		if ( attributeData.name )
		{
			name = attributeData.name;
		}
		else if ( attributeData.id )
		{
			name = attributeData.id;
		}

		mCurrentKinematicsModel = new KinematicsModel(uri, name);
		SidTreeNode* sidTreeNode = addToSidTree( attributeData.id, 0, mCurrentKinematicsModel);
		mCurrentKinematicsModel->setSidTreeNode(sidTreeNode);
		return true;
	}